

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

Am_Value_List get_new_slots_and_values(Am_Object *cmd,Am_Value *new_value,Am_Value *new_obj_val)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  ostream *poVar3;
  Am_Value *in_RCX;
  Am_List_Item *extraout_RDX;
  Am_Value_List AVar4;
  Am_Am_Slot_Key key;
  Am_Object fake_start_object;
  Am_Value_List *slots_and_values_used;
  Am_Value target_v;
  Am_Value_List just_slots;
  Am_Am_Slot_Key local_8a;
  Am_Object local_88;
  Am_Value_List_Data *local_80;
  Am_Value *local_78;
  Am_Value local_70;
  Am_Value_List local_60;
  Am_Value *local_50;
  Am_Value local_48;
  Am_Assoc local_38;
  
  local_88.data = (Am_Object_Data *)0x0;
  local_80 = (Am_Value_List_Data *)cmd;
  local_78 = new_value;
  local_50 = new_obj_val;
  bVar1 = Am_Value::Valid(in_RCX);
  if ((!bVar1) || (in_RCX->type != 0xa001)) {
    in_RCX = Am_Object::Get((Am_Object *)local_78,0x11a,0);
  }
  Am_Object::operator=(&local_88,in_RCX);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_80);
  pAVar2 = Am_Object::Get(&local_88,0xb8,0);
  Am_Value_List::Am_Value_List(&local_60,pAVar2);
  local_8a.value = 0;
  local_70.type = 0;
  local_70.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(&local_60);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_60);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_60);
    Am_Am_Slot_Key::operator=(&local_8a,pAVar2);
    pAVar2 = Am_Object::Get(&local_88,local_8a.value,0);
    Am_Value::operator=(&local_70,pAVar2);
    local_48.value.long_value._2_6_ = 0;
    local_48.value.long_value._0_2_ = local_8a.value;
    local_48.type = 0x4015;
    Am_Assoc::Am_Assoc(&local_38,&local_48,&local_70);
    value = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_38);
    Am_Value_List::Add((Am_Value_List *)local_80,value,Am_TAIL,true);
    Am_Assoc::~Am_Assoc(&local_38);
    Am_Value::~Am_Value(&local_48);
    Am_Value_List::Next(&local_60);
  }
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Create new slots_and_values_used from ",0x26);
    poVar3 = operator<<((ostream *)&std::cout,(Am_Object *)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," and new val ",0xd);
    poVar3 = operator<<(poVar3,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," start object ",0xe);
    poVar3 = operator<<(poVar3,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," list ",6);
    poVar3 = operator<<(poVar3,(Am_Value_List *)local_80);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Value::~Am_Value(&local_70);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(&local_88);
  AVar4.item = extraout_RDX;
  AVar4.data = local_80;
  return AVar4;
}

Assistant:

Am_Value_List
get_new_slots_and_values(Am_Object &cmd, Am_Value &new_value,
                         Am_Value new_obj_val)
{
  Am_Object fake_start_object;
  if (new_obj_val.Valid() && new_obj_val.type == Am_OBJECT)
    fake_start_object = new_obj_val;
  else
    fake_start_object = cmd.Get(Am_START_OBJECT);
  // **** do something with new_value ****
  Am_Value_List slots_and_values_used;
  Am_Value_List just_slots = fake_start_object.Get(Am_SLOTS_TO_SAVE);
  Am_Am_Slot_Key key;
  Am_Value target_v;
  for (just_slots.Start(); !just_slots.Last(); just_slots.Next()) {
    key = just_slots.Get();
    target_v = fake_start_object.Get(key);
    slots_and_values_used.Add(Am_Assoc(key, target_v));
  }
  if (am_sdebug)
    std::cout << "Create new slots_and_values_used from " << cmd
              << " and new val " << new_value << " start object "
              << fake_start_object << " list " << slots_and_values_used
              << std::endl
              << std::flush;
  return slots_and_values_used;
}